

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::fit(CDT *this)

{
  ulong uVar1;
  Matrix<double> *pMVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pLVar5;
  int iVar6;
  undefined1 auVar7 [16];
  pointer pIVar8;
  pointer pIVar9;
  ostream *poVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  Shape SVar20;
  vector<double,_std::allocator<double>_> keys;
  vector<Interval,_std::allocator<Interval>_> intervals;
  double output;
  Matrix<double> mat;
  undefined1 local_f8 [16];
  vector<double,_std::allocator<double>_> local_e8;
  char local_c9;
  vector<Interval,_std::allocator<Interval>_> local_c8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  Matrix<double> local_90;
  
  local_98 = (this->m_info).bias;
  DataSet::matrix(&local_90,&this->m_dataset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dataset bias: ",0xe);
  poVar10 = std::ostream::_M_insert<double>(local_98);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_e8,1);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  pMVar2 = &this->m_input;
  if ((this->m_input).m_shape.n_row != 0) {
    uVar14 = 0;
    do {
      local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_c8);
      }
      else {
        *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (pMVar2->m_shape).n_row);
  }
  pvVar11 = Matrix<double>::operator[]
                      (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_weights,0);
  *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  uVar16._0_4_ = (pMVar2->m_shape).n_row;
  uVar16._4_4_ = (pMVar2->m_shape).n_col;
  if (uVar16._4_4_ == 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pvVar11 = Matrix<double>::operator[]
                          (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
      uVar1 = uVar12 + 1;
      pdVar4 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pMVar2->m_shape).n_row == 0) {
LAB_00106099:
        uVar12 = 0;
        do {
          if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] <=
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 + 1] &&
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 + 1] !=
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12]) {
            uVar14 = (uint)uVar12;
            pvVar11 = Matrix<double>::operator[](pMVar2,uVar14);
            dVar18 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar1];
            local_f8._0_8_ = dVar18;
            pvVar11 = Matrix<double>::operator[](pMVar2,uVar14 + 1);
            pdVar3 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar1;
            if (*pdVar3 <= dVar18 && dVar18 != *pdVar3) {
              local_a8 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
              local_f8._0_8_ =
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12 + 1];
              pvVar11 = Matrix<double>::operator[](pMVar2,uVar14);
              dVar18 = ((double)local_f8._0_8_ - local_a8) /
                       (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar1];
              if (dVar18 < pdVar4[uVar1]) {
                pdVar4[uVar1] = dVar18;
              }
            }
          }
          uVar12 = uVar12 + 1;
          uVar16._0_4_ = (pMVar2->m_shape).n_row;
          uVar16._4_4_ = (pMVar2->m_shape).n_col;
        } while (uVar12 < (undefined4)uVar16 - 1);
      }
      else {
        uVar15 = 0;
        do {
          pvVar11 = Matrix<double>::operator[]
                              (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
          dVar18 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          local_f8._0_8_ = dVar18;
          pvVar11 = Matrix<double>::operator[](pMVar2,(uint)uVar15);
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] =
               dVar18 * (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar12] +
               local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15];
          uVar15 = uVar15 + 1;
          uVar16._0_4_ = (pMVar2->m_shape).n_row;
          uVar16._4_4_ = (pMVar2->m_shape).n_col;
        } while (uVar15 < (uVar16 & 0xffffffff));
        if ((undefined4)uVar16 != 1) goto LAB_00106099;
      }
      iVar6 = (int)(uVar16 >> 0x20);
      uVar12 = uVar1;
    } while (uVar1 < iVar6 - 1);
    uVar12 = (ulong)(iVar6 - 1);
  }
  if ((int)uVar16 != 0) {
    uVar16 = 0;
    do {
      pvVar11 = Matrix<double>::operator[]
                          (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
      dVar18 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      local_f8._0_8_ = dVar18;
      pvVar11 = Matrix<double>::operator[](pMVar2,(uint)uVar16);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar16] =
           dVar18 * (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar12] +
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar16 < (pMVar2->m_shape).n_row);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Updated weights: ",0x11)
  ;
  pLVar5 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pLVar5->m_weights).m_shape.n_col != 0) {
    uVar16 = 0;
    do {
      pvVar11 = Matrix<double>::operator[](&pLVar5->m_weights,0);
      poVar10 = std::ostream::_M_insert<double>
                          ((pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar16]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
      uVar16 = uVar16 + 1;
      pLVar5 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar16 < (pLVar5->m_weights).m_shape.n_col);
  }
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_c8,1);
  uVar14 = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_f8._8_8_;
  local_f8 = auVar7 << 0x40;
  while( true ) {
    pvVar11 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    if ((ulong)((long)(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar14) break;
    pvVar11 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    local_f8._0_8_ =
         (double)local_f8._0_8_ +
         (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14] * local_98;
    uVar14 = uVar14 + 1;
  }
  if ((long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar16 = 0;
    do {
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar16] =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16] - (double)local_f8._0_8_;
      uVar16 = uVar16 + 1;
    } while ((uVar16 & 0xffffffff) <
             (ulong)((long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Key bias: ",10);
  poVar10 = std::ostream::_M_insert<double>((double)local_f8._0_8_);
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_c8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," > Initializing intervals...\n",0x1d);
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar2 = &this->m_output;
  pvVar11 = Matrix<double>::operator[](pMVar2,0);
  local_b0 = *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_a8 = 0.0;
    uStack_a0 = 0;
    uVar16 = 0;
    do {
      pvVar11 = Matrix<double>::operator[](pMVar2,(uint)uVar16);
      dVar18 = *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((dVar18 != local_b0) || (NAN(dVar18) || NAN(local_b0))) {
        std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                  ((vector<Interval,std::allocator<Interval>> *)&local_c8,
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) |
                   (long)local_a8),
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_f8._0_8_ >> 0x3f &
                    (long)((double)local_f8._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_f8._0_8_),&local_b0);
        uVar17 = local_f8._12_4_;
        dVar18 = (double)local_f8._0_8_ + 1.0;
        local_f8._8_4_ = local_f8._8_4_;
        local_f8._0_8_ = dVar18;
        local_f8._12_4_ = uVar17;
        pvVar11 = Matrix<double>::operator[](pMVar2,(uint)(long)dVar18);
        local_b0 = *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        uStack_a0 = local_f8._8_8_;
        local_a8 = dVar18;
      }
      else {
        local_f8._8_8_ = 0;
        local_f8._0_8_ = (double)uVar16;
      }
      uVar12 = (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar12 - 1 == uVar16) {
        std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                  ((vector<Interval,std::allocator<Interval>> *)&local_c8,
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) |
                   (long)local_a8),
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_f8._0_8_ >> 0x3f &
                    (long)((double)local_f8._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_f8._0_8_),&local_b0);
        uVar12 = (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      uVar16 = (ulong)((uint)uVar16 + 1);
    } while (uVar16 < uVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Overfit rate: ",0xe);
  pIVar9 = local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar8 = local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar20 = DataSet::shape(&this->m_dataset);
  lVar13 = ((long)pIVar9 - (long)pIVar8 >> 3) * -0x5555555555555555;
  auVar19._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar19._0_8_ = lVar13;
  auVar19._12_4_ = 0x45300000;
  poVar10 = std::ostream::_M_insert<double>
                      (((auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                       (double)SVar20.n_row);
  local_c9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_c9,1);
  Activation::initialize(&this->m_function,&local_c8);
  if (local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return;
}

Assistant:

void CDT::fit(){
    double bias=m_info.bias;
    Matrix_d mat=m_dataset.matrix();
    std::cout<<"Dataset bias: "<<bias<<'\n';

    // std::cout<<"dc sort:\n"<<m_input<<'\n'<<m_output<<'\n';

    std::vector<double> keys;
    for(unsigned i=0;i<m_input.shape().n_row;++i)
        keys.push_back(0.);
    
    m_layers[0].m_weights[0][0]=1.;
    for(unsigned i=0;i<m_input.shape().n_col-1;++i){
        double& weight=m_layers[0].m_weights[0][i+1];
        for(unsigned t=0;t<m_input.shape().n_row;++t){
            keys[t]+=m_layers[0].m_weights[0][i]*m_input[t][i];
        }
        for(unsigned j=0;j<m_input.shape().n_row-1;++j){
            if(keys[j]<keys[j+1] &&
               m_input[j][i+1]>m_input[j+1][i+1]){
                   double tmp;
                   tmp=(keys[j+1]-keys[j])/m_input[j][i+1];
                   if(weight>tmp) weight=tmp;
               }
        }
    }
    unsigned col=m_input.shape().n_col;
    for(unsigned i=0;i<m_input.shape().n_row;++i){
        keys[i]+=m_layers[0].m_weights[0][col-1]*m_input[i][col-1];
    }

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<"\t";
    }   std::cout<<'\n';

    // Normalizing keys
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // } std::cout<<'\n';

    double key_bias=0.;
    for(unsigned i=0;i<m_layers[0].m_weights[0].size();++i){
        // std::cout<<" |> +"<<m_layers[0].m_weights[0][i]<<" * "<<bias<<'\n';
        key_bias+=m_layers[0].m_weights[0][i]*bias;
    }
    for(unsigned i=0;i<keys.size();++i){
        keys[i]-=key_bias;
    }
    
    std::cout<<"Key bias: "<<key_bias<<'\n';
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // }   std::cout<<'\n';

    std::cout<<" > Initializing intervals...\n";
    
    std::vector<Interval> intervals;
    double beg=0, end, output=m_output[0][0];
    for(unsigned i=0;i<keys.size();++i){
        if(m_output[i][0]==output){
            end=i;
        }
        else{
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
            
            beg=++end;
            output=m_output[beg][0];
        }

        if(i==keys.size()-1){
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
        }
    }
    std::cout<<"Overfit rate: "<<intervals.size()/(double)m_dataset.shape().n_row<<'\n';
    m_function.initialize(intervals);
}